

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

SerializedMessage * __thiscall
miniros::serialization::serializeServiceResponse<std_msgs::String_<std::allocator<void>>>
          (SerializedMessage *__return_storage_ptr__,serialization *this,bool ok,
          String_<std::allocator<void>_> *message)

{
  uint uVar1;
  element_type *peVar2;
  element_type eVar3;
  uchar *puVar4;
  undefined7 in_register_00000011;
  undefined8 *puVar5;
  int iVar6;
  uint8_t *old_data;
  element_type *__dest;
  void *__src;
  ulong uVar7;
  uint8_t *old_data_1;
  element_type *local_38;
  
  puVar5 = (undefined8 *)CONCAT71(in_register_00000011,ok);
  eVar3 = (element_type)this;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  if ((int)this == 0) {
    uVar7 = (ulong)((int)puVar5[1] + 5);
    __return_storage_ptr__->num_bytes = uVar7;
    puVar4 = (uchar *)operator_new__(uVar7);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar4);
    peVar2 = (__return_storage_ptr__->buf).
             super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = (uint)__return_storage_ptr__->num_bytes;
    if ((ulong)uVar1 == 0) {
      throwStreamOverrun();
      *peVar2 = eVar3;
      uVar7 = puVar5[1];
LAB_001fe285:
      throwStreamOverrun();
    }
    else {
      *peVar2 = eVar3;
      uVar7 = puVar5[1];
      if (uVar1 < 5) goto LAB_001fe285;
    }
    __dest = peVar2 + 5;
    *(int *)(peVar2 + 1) = (int)uVar7;
    if (uVar7 == 0) {
      return __return_storage_ptr__;
    }
    if (peVar2 + uVar1 < __dest + (uVar7 & 0xffffffff)) {
      throwStreamOverrun();
    }
    __src = (void *)*puVar5;
    goto LAB_001fe2ad;
  }
  uVar7 = (ulong)((int)puVar5[1] + 9);
  __return_storage_ptr__->num_bytes = uVar7;
  puVar4 = (uchar *)operator_new__(uVar7);
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             puVar4);
  peVar2 = (__return_storage_ptr__->buf).
           super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (uint)__return_storage_ptr__->num_bytes;
  if ((ulong)uVar1 == 0) {
    throwStreamOverrun();
    *peVar2 = eVar3;
    iVar6 = (int)__return_storage_ptr__->num_bytes + -5;
LAB_001fe231:
    throwStreamOverrun();
    *(int *)(peVar2 + 1) = iVar6;
    uVar7 = puVar5[1];
LAB_001fe245:
    throwStreamOverrun();
  }
  else {
    *peVar2 = eVar3;
    iVar6 = (int)__return_storage_ptr__->num_bytes + -5;
    if (uVar1 < 5) goto LAB_001fe231;
    *(int *)(peVar2 + 1) = iVar6;
    uVar7 = puVar5[1];
    if (uVar1 < 9) goto LAB_001fe245;
  }
  local_38 = peVar2 + 5;
  __dest = peVar2 + 9;
  *(int *)local_38 = (int)uVar7;
  if (uVar7 == 0) {
    return __return_storage_ptr__;
  }
  if (peVar2 + uVar1 < __dest + (uVar7 & 0xffffffff)) {
    throwStreamOverrun();
  }
  __src = (void *)*puVar5;
LAB_001fe2ad:
  memcpy(__dest,__src,uVar7);
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeServiceResponse(bool ok, const M& message)
{
  SerializedMessage m;

  if (ok)
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 5;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, static_cast<uint32_t>(m.num_bytes) - 5);
    serialize(s, message);
  }
  else
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 1;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, message);
  }

  return m;
}